

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMFormatT.cc
# Opt level: O0

size_t OpenMesh::IO::restore<unsigned_long>
                 (unsigned_long *_is,unsigned_long *_val,undefined4 _b,byte _swap)

{
  bool bVar1;
  unsigned_long local_40;
  uint64 v_3;
  uint32 v_2;
  uint16 v_1;
  uint8 v;
  size_t bytes;
  bool _swap_local;
  unsigned_long *puStack_20;
  Integer_Size _b_local;
  unsigned_long *_val_local;
  istream *_is_local;
  
  bytes._3_1_ = _swap & 1;
  bytes._4_4_ = _b;
  puStack_20 = _val;
  _val_local = _is;
  bVar1 = OMFormat::is_integer<unsigned_long>(*_val);
  if (bVar1) {
    _v_2 = 0;
    switch(bytes._4_4_) {
    case 0:
      _v_2 = restore<unsigned_char>
                       ((istream *)_val_local,(uchar *)((long)&v_3 + 7),(bool)(bytes._3_1_ & 1));
      *puStack_20 = (ulong)v_3._7_1_;
      break;
    case 1:
      _v_2 = restore<unsigned_short>
                       ((istream *)_val_local,(unsigned_short *)((long)&v_3 + 4),
                        (bool)(bytes._3_1_ & 1));
      *puStack_20 = (ulong)v_3._4_2_;
      break;
    case 2:
      _v_2 = restore<unsigned_int>((istream *)_val_local,(uint *)&v_3,(bool)(bytes._3_1_ & 1));
      *puStack_20 = (ulong)(uint)v_3;
      break;
    case 3:
      _v_2 = restore<unsigned_long_long>((istream *)_val_local,&local_40,(bool)(bytes._3_1_ & 1));
      *puStack_20 = local_40;
    }
    return _v_2;
  }
  __assert_fail("OMFormat::is_integer( _val )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/IO/OMFormatT.cc"
                ,0xc2,
                "size_t OpenMesh::IO::restore(std::istream &, T &, OMFormat::Chunk::Integer_Size, bool, t_unsigned) [T = unsigned long]"
               );
}

Assistant:

size_t 
  restore( std::istream& _is, 
	   T& _val, 
	   OMFormat::Chunk::Integer_Size _b, 
	   bool _swap,
	   t_unsigned)
  {    
    assert( OMFormat::is_integer( _val ) );
    size_t bytes = 0;

    switch( _b ) 
    {
      case OMFormat::Chunk::Integer_8:
      { 
	OMFormat::uint8 v;
	bytes = restore( _is, v, _swap );
	_val = static_cast<T>(v);
	break;
      }
      case OMFormat::Chunk::Integer_16:
      { 
	OMFormat::uint16 v;
	bytes = restore( _is, v, _swap );
	_val = static_cast<T>(v);
	break;
      }
      case OMFormat::Chunk::Integer_32:
      { 
	OMFormat::uint32 v;
	bytes = restore( _is, v, _swap );
	_val = static_cast<T>(v);
	break;
      }
      
      case OMFormat::Chunk::Integer_64:
      { 
	OMFormat::uint64 v;
	bytes = restore( _is, v, _swap );
	_val = static_cast<T>(v);
	break;
      }
    }
    return bytes;
  }